

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_address.cpp
# Opt level: O2

void __thiscall
AddressFactory_Constructor_type_prefix_Test::AddressFactory_Constructor_type_prefix_Test
          (AddressFactory_Constructor_type_prefix_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_0029ea80;
  return;
}

Assistant:

TEST(AddressFactory, Constructor_type_prefix)
{
  EXPECT_NO_THROW(AddressFactory factory(NetType::kMainnet, GetBitcoinAddressFormatList()));
  EXPECT_NO_THROW(AddressFactory factory(NetType::kTestnet, GetBitcoinAddressFormatList()));
  EXPECT_NO_THROW(AddressFactory factory(NetType::kRegtest, GetBitcoinAddressFormatList()));

  Pubkey pubkey = Pubkey("027592aab5d43618dda13fba71e3993cd7517a712d3da49664c06ee1bd3d1f70af");
  {
    AddressFactory factory(NetType::kMainnet, GetBitcoinAddressFormatList());
    Address address = factory.CreateP2pkhAddress(pubkey);
    EXPECT_EQ(address.GetNetType(), NetType::kMainnet);
    EXPECT_EQ(address.GetWitnessVersion(), WitnessVersion::kVersionNone);
  }
  {
    AddressFactory factory(NetType::kTestnet, GetBitcoinAddressFormatList());
    Address address = factory.CreateP2wpkhAddress(pubkey);
    EXPECT_EQ(address.GetNetType(), NetType::kTestnet);
    EXPECT_EQ(address.GetWitnessVersion(), WitnessVersion::kVersion0);
  }
  {
    AddressFactory factory(NetType::kRegtest, GetBitcoinAddressFormatList());
    Address address = factory.CreateP2pkhAddress(pubkey);
    EXPECT_EQ(address.GetNetType(), NetType::kRegtest);
    EXPECT_EQ(address.GetWitnessVersion(), WitnessVersion::kVersionNone);
  }

  // error
  {
    AddressFactory factory(NetType::kLiquidV1, GetBitcoinAddressFormatList());
    EXPECT_THROW((factory.CreateP2pkhAddress(pubkey)), CfdException);
  }
  {
    AddressFactory factory(NetType::kElementsRegtest, GetBitcoinAddressFormatList());
    EXPECT_THROW((factory.CreateP2pkhAddress(pubkey)), CfdException);
  }
}